

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_intel.cc
# Opt level: O0

void handle_cpu_env(uint32_t *out,char *in)

{
  uint uVar1;
  uint uVar2;
  ulonglong uVar3;
  bool local_4a;
  bool local_49;
  unsigned_long_long v;
  char *end;
  char *start;
  uint local_28;
  int base;
  int hex;
  int skip_first_byte;
  int or_op;
  int invert_op;
  char *in_local;
  uint32_t *out_local;
  
  skip_first_byte = (int)(*in == '~');
  hex = (int)(*in == '|');
  local_49 = skip_first_byte != 0 || hex != 0;
  base = (int)local_49;
  local_4a = false;
  if (in[base] == '0') {
    local_4a = in[(int)(base + 1)] == 'x';
  }
  local_28 = (uint)local_4a;
  start._4_4_ = 10;
  if (local_28 != 0) {
    start._4_4_ = 0x10;
  }
  end = in + base;
  _or_op = in;
  in_local = (char *)out;
  uVar3 = strtoull(end,(char **)&v,start._4_4_);
  if (((char *)v != end) && (*(char *)v == '\0')) {
    uVar1 = (uint)uVar3;
    uVar2 = (uint)(uVar3 >> 0x20);
    if (skip_first_byte == 0) {
      if (hex == 0) {
        *(uint *)in_local = uVar1;
        *(uint *)(in_local + 4) = uVar2;
      }
      else {
        *(uint *)in_local = *(uint *)in_local | uVar1;
        *(uint *)(in_local + 4) = *(uint *)(in_local + 4) | uVar2;
      }
    }
    else {
      *(uint *)in_local = *(uint *)in_local & (uVar1 ^ 0xffffffff);
      *(uint *)(in_local + 4) = *(uint *)(in_local + 4) & (uVar2 ^ 0xffffffff);
    }
  }
  return;
}

Assistant:

static void handle_cpu_env(uint32_t *out, const char *in) {
  const int invert_op = in[0] == '~';
  const int or_op = in[0] == '|';
  const int skip_first_byte = invert_op || or_op;
  const int hex = in[skip_first_byte] == '0' && in[skip_first_byte + 1] == 'x';
  const int base = hex ? 16 : 10;

  const char *start = in + skip_first_byte;
  char *end;
  unsigned long long v = strtoull(start, &end, base);

  if (end == start || *end != '\0') {
    return;
  }

  if (invert_op) {
    out[0] &= ~v;
    out[1] &= ~(v >> 32);
  } else if (or_op) {
    out[0] |= v;
    out[1] |= (v >> 32);
  } else {
    out[0] = v;
    out[1] = v >> 32;
  }
}